

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.c
# Opt level: O0

void ignore_end_spaces(char *str)

{
  size_t sVar1;
  char *in_RDI;
  bool bVar2;
  char *end;
  char *local_10;
  
  sVar1 = strlen(in_RDI);
  local_10 = in_RDI + sVar1;
  while( true ) {
    bVar2 = false;
    if ((((in_RDI < local_10) && (bVar2 = true, *local_10 != ' ')) &&
        (bVar2 = true, *local_10 != '\t')) &&
       ((bVar2 = true, *local_10 != '\n' && (bVar2 = true, *local_10 != '\r')))) {
      bVar2 = *local_10 == '\0';
    }
    if (!bVar2) break;
    local_10 = local_10 + -1;
  }
  if (in_RDI <= local_10) {
    local_10[1] = '\0';
  }
  return;
}

Assistant:

static void ignore_end_spaces(char *str) {
  char *end = str + strlen(str);
  while (end > str && (end[0] == ' ' || end[0] == '\t' || end[0] == '\n' ||
                       end[0] == '\r' || end[0] == '\0'))
    --end;
  if (end >= str) end[1] = '\0';
}